

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O0

Matte * __thiscall pm::World::createMaterial<pm::Matte>(World *this)

{
  reference this_00;
  Matte *pMVar1;
  unique_ptr<pm::Matte,_std::default_delete<pm::Matte>_> local_20;
  unique_ptr<pm::Material,_std::default_delete<pm::Material>_> local_18;
  World *local_10;
  World *this_local;
  
  local_10 = this;
  std::make_unique<pm::Matte>();
  std::unique_ptr<pm::Material,std::default_delete<pm::Material>>::
  unique_ptr<pm::Matte,std::default_delete<pm::Matte>,void>
            ((unique_ptr<pm::Material,std::default_delete<pm::Material>> *)&local_18,&local_20);
  std::
  vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ::push_back(&this->materials_,(value_type *)&local_18);
  std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::~unique_ptr(&local_18);
  std::unique_ptr<pm::Matte,_std::default_delete<pm::Matte>_>::~unique_ptr(&local_20);
  this_00 = std::
            vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
            ::back(&this->materials_);
  pMVar1 = (Matte *)std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::get(this_00);
  return pMVar1;
}

Assistant:

T *World::createMaterial(Args &&... args)
{
	materials_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
	return static_cast<T *>(materials_.back().get());
}